

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

exr_result_t
validate_and_compute_tile_chunk_off
          (exr_const_context_t ctxt,exr_const_priv_part_t part,int tilex,int tiley,int levelx,
          int levely,int32_t *chunkoffout)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  exr_result_t eVar4;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined4 *in_stack_00000008;
  int lx_1;
  int lx;
  int ly;
  int l;
  int64_t chunkoff;
  exr_attr_tiledesc_t *tiledesc;
  int numy;
  int numx;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  long local_48;
  exr_result_t local_c;
  
  local_48 = 0;
  if ((((*(long *)(in_RSI + 0x60) == 0) || (*(int *)(in_RSI + 0xc0) < 1)) ||
      (*(int *)(in_RSI + 0xc4) < 1)) ||
     ((*(long *)(in_RSI + 200) == 0 || (*(long *)(in_RSI + 0xd0) == 0)))) {
    local_c = (**(code **)(in_RDI + 0x48))(in_RDI,0xd,"Tile descriptor data missing or corrupt");
  }
  else if (((in_EDX < 0) || (in_ECX < 0)) || ((in_R8D < 0 || (in_R9D < 0)))) {
    local_c = (**(code **)(in_RDI + 0x48))
                        (in_RDI,3,"Invalid tile indices provided (%d, %d, level %d, %d)",in_EDX,
                         in_ECX,in_R8D);
  }
  else {
    bVar3 = *(byte *)(*(long *)(*(long *)(in_RSI + 0x60) + 0x18) + 8) & 0xf;
    if (bVar3 < 2) {
      if (in_R8D != in_R9D) {
        eVar4 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,3,
                           "Request for tile (%d, %d) level (%d, %d), but single level and mipmap tiles must have same level x and y"
                           ,in_EDX,in_ECX,in_R8D);
        return eVar4;
      }
      if (*(int *)(in_RSI + 0xc0) <= in_R8D) {
        eVar4 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,3,
                           "Request for tile (%d, %d) level %d, but level past available levels (%d)"
                           ,in_EDX,in_ECX,in_R8D,*(undefined4 *)(in_RSI + 0xc0));
        return eVar4;
      }
      iVar1 = *(int *)(*(long *)(in_RSI + 200) + (long)in_R8D * 4);
      iVar2 = *(int *)(*(long *)(in_RSI + 0xd0) + (long)in_R8D * 4);
      if ((iVar1 <= in_EDX) || (iVar2 <= in_ECX)) {
        eVar4 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,3,
                           "Request for tile (%d, %d) level %d, but level only has %d x %d tiles",
                           in_EDX,in_ECX,in_R8D,iVar1,iVar2);
        return eVar4;
      }
      for (local_4c = 0; local_4c < in_R8D; local_4c = local_4c + 1) {
        local_48 = (long)*(int *)(*(long *)(in_RSI + 200) + (long)local_4c * 4) *
                   (long)*(int *)(*(long *)(in_RSI + 0xd0) + (long)local_4c * 4) + local_48;
      }
      local_48 = (in_ECX * iVar1 + in_EDX) + local_48;
    }
    else {
      if (bVar3 != 2) {
        eVar4 = (**(code **)(in_RDI + 0x48))(in_RDI,0x21,"Invalid tile description");
        return eVar4;
      }
      if (*(int *)(in_RSI + 0xc0) <= in_R8D) {
        eVar4 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,3,
                           "Request for tile (%d, %d) level %d, %d, but x level past available levels (%d)"
                           ,in_EDX,in_ECX,in_R8D);
        return eVar4;
      }
      if (*(int *)(in_RSI + 0xc4) <= in_R9D) {
        eVar4 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,3,
                           "Request for tile (%d, %d) level %d, %d, but y level past available levels (%d)"
                           ,in_EDX,in_ECX,in_R8D);
        return eVar4;
      }
      iVar1 = *(int *)(*(long *)(in_RSI + 200) + (long)in_R8D * 4);
      iVar2 = *(int *)(*(long *)(in_RSI + 0xd0) + (long)in_R9D * 4);
      if ((iVar1 <= in_EDX) || (iVar2 <= in_ECX)) {
        eVar4 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,3,
                           "Request for tile (%d, %d) at rip level %d, %d level only has %d x %d tiles"
                           ,in_EDX,in_ECX,in_R8D);
        return eVar4;
      }
      for (local_50 = 0; local_50 < in_R9D; local_50 = local_50 + 1) {
        for (local_54 = 0; local_54 < *(int *)(in_RSI + 0xc0); local_54 = local_54 + 1) {
          local_48 = (long)*(int *)(*(long *)(in_RSI + 200) + (long)local_54 * 4) *
                     (long)*(int *)(*(long *)(in_RSI + 0xd0) + (long)local_50 * 4) + local_48;
        }
      }
      for (local_58 = 0; local_58 < in_R8D; local_58 = local_58 + 1) {
        local_48 = (long)*(int *)(*(long *)(in_RSI + 200) + (long)local_58 * 4) * (long)iVar2 +
                   local_48;
      }
      local_48 = (in_ECX * iVar1 + in_EDX) + local_48;
    }
    if (local_48 < *(int *)(in_RSI + 0xf4)) {
      *in_stack_00000008 = (int)local_48;
      local_c = 0;
    }
    else {
      local_c = (**(code **)(in_RDI + 0x48))
                          (in_RDI,0x21,"Invalid tile chunk offset %ld (%d avail)",local_48,
                           *(undefined4 *)(in_RSI + 0xf4));
    }
  }
  return local_c;
}

Assistant:

static exr_result_t
validate_and_compute_tile_chunk_off (
    exr_const_context_t   ctxt,
    exr_const_priv_part_t part,
    int                   tilex,
    int                   tiley,
    int                   levelx,
    int                   levely,
    int32_t*              chunkoffout)
{
    int                        numx, numy;
    const exr_attr_tiledesc_t* tiledesc;
    int64_t                    chunkoff = 0;

    if (!part->tiles || part->num_tile_levels_x <= 0 ||
        part->num_tile_levels_y <= 0 || !part->tile_level_tile_count_x ||
        !part->tile_level_tile_count_y)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_MISSING_REQ_ATTR,
            "Tile descriptor data missing or corrupt");
    }

    if (tilex < 0 || tiley < 0 || levelx < 0 || levely < 0)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid tile indices provided (%d, %d, level %d, %d)",
            tilex,
            tiley,
            levelx,
            levely);

    tiledesc = part->tiles->tiledesc;
    switch (EXR_GET_TILE_LEVEL_MODE ((*tiledesc)))
    {
        case EXR_TILE_ONE_LEVEL:
        case EXR_TILE_MIPMAP_LEVELS:
            if (levelx != levely)
            {
                return ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "Request for tile (%d, %d) level (%d, %d), but single level and mipmap tiles must have same level x and y",
                    tilex,
                    tiley,
                    levelx,
                    levely);
            }
            if (levelx >= part->num_tile_levels_x)
            {
                return ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "Request for tile (%d, %d) level %d, but level past available levels (%d)",
                    tilex,
                    tiley,
                    levelx,
                    part->num_tile_levels_x);
            }

            numx = part->tile_level_tile_count_x[levelx];
            numy = part->tile_level_tile_count_y[levelx];

            if (tilex >= numx || tiley >= numy)
            {
                return ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "Request for tile (%d, %d) level %d, but level only has %d x %d tiles",
                    tilex,
                    tiley,
                    levelx,
                    numx,
                    numy);
            }

            for (int l = 0; l < levelx; ++l)
                chunkoff +=
                    ((int64_t) part->tile_level_tile_count_x[l] *
                     (int64_t) part->tile_level_tile_count_y[l]);
            chunkoff += tiley * numx + tilex;
            break;

        case EXR_TILE_RIPMAP_LEVELS:
            if (levelx >= part->num_tile_levels_x)
            {
                return ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "Request for tile (%d, %d) level %d, %d, but x level past available levels (%d)",
                    tilex,
                    tiley,
                    levelx,
                    levely,
                    part->num_tile_levels_x);
            }
            if (levely >= part->num_tile_levels_y)
            {
                return ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "Request for tile (%d, %d) level %d, %d, but y level past available levels (%d)",
                    tilex,
                    tiley,
                    levelx,
                    levely,
                    part->num_tile_levels_y);
            }

            numx = part->tile_level_tile_count_x[levelx];
            numy = part->tile_level_tile_count_y[levely];

            if (tilex >= numx || tiley >= numy)
            {
                return ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "Request for tile (%d, %d) at rip level %d, %d level only has %d x %d tiles",
                    tilex,
                    tiley,
                    levelx,
                    levely,
                    numx,
                    numy);
            }

            for (int ly = 0; ly < levely; ++ly)
            {
                for (int lx = 0; lx < part->num_tile_levels_x; ++lx)
                {
                    chunkoff +=
                        ((int64_t) part->tile_level_tile_count_x[lx] *
                         (int64_t) part->tile_level_tile_count_y[ly]);
                }
            }
            for (int lx = 0; lx < levelx; ++lx)
            {
                chunkoff +=
                    ((int64_t) part->tile_level_tile_count_x[lx] *
                     (int64_t) numy);
            }
            chunkoff += tiley * numx + tilex;
            break;
        case EXR_TILE_LAST_TYPE:
        default:
            return ctxt->print_error (
                ctxt, EXR_ERR_UNKNOWN, "Invalid tile description");
    }

    if (chunkoff >= part->chunk_count)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_UNKNOWN,
            "Invalid tile chunk offset %" PRId64 " (%d avail)",
            chunkoff,
            part->chunk_count);
    }

    *chunkoffout = (int32_t) chunkoff;
    return EXR_ERR_SUCCESS;
}